

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook.c
# Opt level: O3

funchook_t * funchook_create(void)

{
  funchook_t *funchook;
  
  funchook_log((funchook_t *)0x0,"Enter funchook_create()\n");
  funchook = funchook_alloc();
  if ((funchook != (funchook_t *)0x0) && (num_entries_in_page == 0)) {
    num_entries_in_page = 0x38;
    funchook_log(funchook,"  page_size=%lu\n  num_entries_in_page=%lu\n",0x1000);
  }
  funchook_log_end(funchook,"Leave funchook_create() => %p\n",funchook);
  return funchook;
}

Assistant:

funchook_t *funchook_create(void)
{
    funchook_t *funchook = NULL;

    funchook_log(funchook, "Enter funchook_create()\n");
    funchook = funchook_create_internal();
    funchook_log_end(funchook, "Leave funchook_create() => %p\n", funchook);
    return funchook;
}